

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_hessian_filter(REF_DBL *metric,REF_GRID ref_grid)

{
  double *pdVar1;
  REF_NODE pRVar2;
  REF_MPI ref_mpi;
  uint uVar3;
  int iVar4;
  REF_DBL *pRVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  REF_STATUS RVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  REF_DBL max_threshold;
  REF_DBL temp;
  REF_DBL diag [12];
  double local_d8;
  REF_DBL *local_d0;
  REF_DBL *local_c8;
  REF_DBL *local_c0;
  void *local_b8;
  REF_MPI local_b0;
  double local_a8;
  double local_a0;
  undefined1 local_98 [16];
  double local_88;
  
  pRVar2 = ref_grid->node;
  uVar3 = pRVar2->max;
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x394,
           "ref_metric_hessian_filter","malloc min_h of REF_DBL negative");
    RVar8 = 1;
  }
  else {
    local_b0 = ref_grid->mpi;
    pRVar5 = (REF_DBL *)malloc(uVar9 * 8);
    if (pRVar5 == (REF_DBL *)0x0) {
      pcVar10 = "malloc min_h of REF_DBL NULL";
      uVar7 = 0x394;
    }
    else {
      pRVar6 = (REF_DBL *)malloc(uVar9 * 0x30);
      if (pRVar6 == (REF_DBL *)0x0) {
        pcVar10 = "malloc hess_min_h of REF_DBL NULL";
        uVar7 = 0x395;
      }
      else {
        local_c0 = pRVar6;
        local_b8 = malloc(uVar9 * 8);
        if (local_b8 != (void *)0x0) {
          local_d0 = pRVar5;
          local_c8 = metric;
          if (uVar3 != 0) {
            lVar11 = 0;
            do {
              if (-1 < pRVar2->global[lVar11]) {
                uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
                if (uVar3 != 0) {
                  pcVar10 = "decomp";
                  uVar7 = 0x39a;
                  goto LAB_00186392;
                }
                if (ref_grid->twod == 0) {
                  uVar3 = ref_matrix_descending_eig((REF_DBL *)local_98);
                  if (uVar3 != 0) {
                    pcVar10 = "3D ascend";
                    uVar7 = 0x39e;
                    goto LAB_00186392;
                  }
                }
                else {
                  uVar3 = ref_matrix_descending_eig_twod((REF_DBL *)local_98);
                  if (uVar3 != 0) {
                    pcVar10 = "2D ascend";
                    uVar7 = 0x39c;
                    goto LAB_00186392;
                  }
                }
                dVar15 = 0.0;
                if (0.0 <= (double)local_98._0_8_) {
                  dVar15 = (double)local_98._0_8_;
                }
                dVar12 = SQRT(dVar15) * 1e+20;
                if (dVar12 <= -dVar12) {
                  dVar12 = -dVar12;
                }
                local_d0[lVar11] =
                     (REF_DBL)(~-(ulong)(1.0 < dVar12) & 0x6974e718d7d7625a |
                              (ulong)(1.0 / SQRT(dVar15)) & -(ulong)(1.0 < dVar12));
                uVar9 = (ulong)(uint)pRVar2->max;
              }
              lVar11 = lVar11 + 1;
              metric = metric + 6;
            } while (lVar11 < (int)uVar9);
          }
          uVar3 = ref_recon_hessian(ref_grid,local_d0,local_c0,REF_RECON_L2PROJECTION);
          if (uVar3 == 0) {
            local_d8 = 0.0;
            iVar4 = pRVar2->max;
            dVar15 = 0.0;
            if (0 < iVar4) {
              lVar11 = 0;
              pRVar5 = local_c0;
              dVar15 = 0.0;
              do {
                if (-1 < pRVar2->global[lVar11]) {
                  uVar3 = ref_matrix_diag_m(pRVar5,(REF_DBL *)local_98);
                  if (uVar3 != 0) {
                    pcVar10 = "decomp";
                    uVar7 = 0x3ae;
                    goto LAB_00186392;
                  }
                  if (ref_grid->twod == 0) {
                    uVar3 = ref_matrix_descending_eig((REF_DBL *)local_98);
                    if (uVar3 != 0) {
                      pcVar10 = "3D ascend";
                      uVar7 = 0x3b2;
                      goto LAB_00186392;
                    }
                  }
                  else {
                    uVar3 = ref_matrix_descending_eig_twod((REF_DBL *)local_98);
                    if (uVar3 != 0) {
                      pcVar10 = "2D ascend";
                      uVar7 = 0x3b0;
                      goto LAB_00186392;
                    }
                  }
                  dVar15 = (double)local_98._0_8_;
                  if ((double)local_98._0_8_ <= -(double)local_98._0_8_) {
                    dVar15 = -(double)local_98._0_8_;
                  }
                  dVar12 = log10(dVar15);
                  *(double *)((long)local_b8 + lVar11 * 8) = dVar12;
                  dVar15 = local_d8;
                  if (local_d8 <= dVar12) {
                    dVar15 = dVar12;
                  }
                  iVar4 = pRVar2->max;
                  local_d8 = dVar15;
                }
                lVar11 = lVar11 + 1;
                pRVar5 = pRVar5 + 6;
              } while (lVar11 < iVar4);
            }
            ref_mpi = local_b0;
            local_a0 = dVar15;
            uVar3 = ref_mpi_max(local_b0,&local_a0,&local_d8,3);
            pRVar5 = local_c8;
            if (uVar3 == 0) {
              local_d8 = local_d8 * 0.5;
              if ((long)pRVar2->max < 1) {
                local_a8 = 0.0;
              }
              else {
                auVar13 = ZEXT816(0);
                lVar11 = 0;
                do {
                  if ((-1 < pRVar2->global[lVar11]) &&
                     (pdVar1 = (double *)((long)local_b8 + lVar11 * 8),
                     *pdVar1 <= local_d8 && local_d8 != *pdVar1)) {
                    dVar12 = local_d0[lVar11] * local_d0[lVar11];
                    dVar15 = dVar12 * 1e+20;
                    if (dVar15 <= -dVar15) {
                      dVar15 = -dVar15;
                    }
                    if ((1.0 < dVar15) && (dVar12 = 1.0 / dVar12, auVar13._0_8_ <= dVar12)) {
                      auVar13._0_8_ = dVar12;
                    }
                  }
                  local_a8 = auVar13._0_8_;
                  lVar11 = lVar11 + 1;
                } while (pRVar2->max != lVar11);
              }
              local_a0 = local_a8;
              uVar3 = ref_mpi_max(ref_mpi,&local_a0,&local_a8,3);
              if (uVar3 == 0) {
                iVar4 = pRVar2->max;
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    if (-1 < pRVar2->global[lVar11]) {
                      uVar3 = ref_matrix_diag_m(pRVar5,(REF_DBL *)local_98);
                      if (uVar3 != 0) {
                        pcVar10 = "decomp";
                        uVar7 = 0x3cd;
                        goto LAB_00186392;
                      }
                      if (ref_grid->twod == 0) {
                        uVar3 = ref_matrix_descending_eig((REF_DBL *)local_98);
                        if (uVar3 != 0) {
                          pcVar10 = "3D ascend";
                          uVar7 = 0x3d1;
                          goto LAB_00186392;
                        }
                      }
                      else {
                        uVar3 = ref_matrix_descending_eig_twod((REF_DBL *)local_98);
                        if (uVar3 != 0) {
                          pcVar10 = "2D ascend";
                          uVar7 = 0x3cf;
                          goto LAB_00186392;
                        }
                      }
                      auVar14._8_8_ = local_a8;
                      auVar14._0_8_ = local_a8;
                      local_98 = minpd(local_98,auVar14);
                      if ((ref_grid->twod == 0) && (local_a8 <= local_88)) {
                        local_88 = local_a8;
                      }
                      uVar3 = ref_matrix_form_m((REF_DBL *)local_98,pRVar5);
                      if (uVar3 != 0) {
                        pcVar10 = "reform";
                        uVar7 = 0x3d7;
                        goto LAB_00186392;
                      }
                      iVar4 = pRVar2->max;
                    }
                    lVar11 = lVar11 + 1;
                    pRVar5 = pRVar5 + 6;
                  } while (lVar11 < iVar4);
                }
                free(local_b8);
                free(local_c0);
                free(local_d0);
                return 0;
              }
              pcVar10 = "max";
              uVar7 = 0x3c7;
            }
            else {
              pcVar10 = "max";
              uVar7 = 0x3b8;
            }
          }
          else {
            pcVar10 = "hess";
            uVar7 = 0x3a9;
          }
LAB_00186392:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar7,"ref_metric_hessian_filter",(ulong)uVar3,pcVar10);
          return uVar3;
        }
        pcVar10 = "malloc threshold of REF_DBL NULL";
        uVar7 = 0x396;
        local_b8 = (void *)0x0;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
           "ref_metric_hessian_filter",pcVar10);
    RVar8 = 2;
  }
  return RVar8;
}

Assistant:

REF_FCN REF_STATUS ref_metric_hessian_filter(REF_DBL *metric,
                                             REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_DBL *min_h, *hess_min_h, *threshold;
  REF_DBL temp, max_threshold, max_valid, eig;
  REF_INT node;
  ref_malloc(min_h, ref_node_max(ref_node), REF_DBL);
  ref_malloc(hess_min_h, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(threshold, ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    min_h[node] = sqrt(MAX(0.0, ref_matrix_eig(diag, 0)));
    if (ref_math_divisible(1.0, min_h[node])) {
      min_h[node] = 1.0 / min_h[node];
    } else {
      min_h[node] = REF_DBL_MAX;
    }
  }

  RSS(ref_recon_hessian(ref_grid, min_h, hess_min_h, REF_RECON_L2PROJECTION),
      "hess");

  max_threshold = 0.0;
  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(hess_min_h[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    threshold[node] = log10(ABS(ref_matrix_eig(diag, 0)));
    max_threshold = MAX(max_threshold, threshold[node]);
  }
  temp = max_threshold;
  RSS(ref_mpi_max(ref_mpi, &temp, &max_threshold, REF_DBL_TYPE), "max");

  /* find the largest valid eigenvalue that is not in a discontinuity */
  max_threshold = 0.5 * max_threshold;
  max_valid = 0.0;
  each_ref_node_valid_node(ref_node, node) {
    if (threshold[node] < max_threshold) {
      REF_DBL h2 = min_h[node] * min_h[node];
      if (ref_math_divisible(1.0, h2)) {
        eig = 1.0 / h2;
        max_valid = MAX(max_valid, eig);
      }
    }
  }
  temp = max_valid;
  RSS(ref_mpi_max(ref_mpi, &temp, &max_valid, REF_DBL_TYPE), "max");

  /* limit hessian eigenvalues everwhere based on what is considered valid
   * outside a discontinuity */
  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    ref_matrix_eig(diag, 0) = MIN(ref_matrix_eig(diag, 0), max_valid);
    ref_matrix_eig(diag, 1) = MIN(ref_matrix_eig(diag, 1), max_valid);
    if (!ref_grid_twod(ref_grid))
      ref_matrix_eig(diag, 2) = MIN(ref_matrix_eig(diag, 2), max_valid);
    RSS(ref_matrix_form_m(diag, &(metric[6 * node])), "reform");
  }
  ref_free(threshold);
  ref_free(hess_min_h);
  ref_free(min_h);

  return REF_SUCCESS;
}